

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall
S2Builder::SortSitesByDistance
          (S2Builder *this,S2Point *x,compact_array<int,_std::allocator<int>_> *sites)

{
  int *__i;
  int *piVar1;
  uint uVar2;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *__first;
  long lVar3;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:748:13)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:748:13)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:748:13)>
  __comp_01;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:748:13)>
  __comp_02;
  
  if ((sites->super_compact_array_base<int,_std::allocator<int>_>).is_inlined_ == false) {
    __first = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
              (sites->super_compact_array_base<int,_std::allocator<int>_>).field_7.pointer_;
  }
  else {
    __first = &(sites->super_compact_array_base<int,_std::allocator<int>_>).field_7;
  }
  uVar2 = *(uint *)&sites->super_compact_array_base<int,_std::allocator<int>_> & 0xffffff;
  if (uVar2 != 0) {
    piVar1 = (int *)((long)__first + (ulong)uVar2 * 4);
    lVar3 = 0x3f;
    if ((ulong)uVar2 != 0) {
      for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    __comp_00._M_comp.this = this;
    __comp_00._M_comp.x = x;
    std::
    __introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::SortSitesByDistance(Vector3<double>const&,gtl::compact_array<int,std::allocator<int>>*)const::__0>>
              ((int *)__first->more_inlined_elements_,piVar1,
               (ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,__comp_00);
    if (uVar2 < 0x11) {
      __comp_02._M_comp.this = this;
      __comp_02._M_comp.x = x;
      std::
      __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::SortSitesByDistance(Vector3<double>const&,gtl::compact_array<int,std::allocator<int>>*)const::__0>>
                ((int *)__first->more_inlined_elements_,piVar1,__comp_02);
      return;
    }
    piVar1 = (int *)(__first + 8);
    __comp_01._M_comp.this = this;
    __comp_01._M_comp.x = x;
    std::
    __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::SortSitesByDistance(Vector3<double>const&,gtl::compact_array<int,std::allocator<int>>*)const::__0>>
              ((int *)__first->more_inlined_elements_,piVar1,__comp_01);
    for (lVar3 = (ulong)uVar2 * 4 + -0x40; lVar3 != 0; lVar3 = lVar3 + -4) {
      __comp._M_comp.this = this;
      __comp._M_comp.x = x;
      std::
      __unguarded_linear_insert<int*,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::SortSitesByDistance(Vector3<double>const&,gtl::compact_array<int,std::allocator<int>>*)const::__0>>
                (piVar1,__comp);
      piVar1 = piVar1 + 1;
    }
  }
  return;
}

Assistant:

void S2Builder::SortSitesByDistance(const S2Point& x,
                                    compact_array<SiteId>* sites) const {
  // Sort sites in increasing order of distance to X.
  std::sort(sites->begin(), sites->end(),
            [&x, this](SiteId i, SiteId j) {
      return s2pred::CompareDistances(x, sites_[i], sites_[j]) < 0;
    });
}